

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_0::ValidateOperandDebugType
          (ValidationState_t *_,string *debug_inst_name,Instruction *inst,uint32_t word_index,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *ext_inst_name,bool allow_template_param)

{
  ostream *poVar1;
  bool bVar2;
  Instruction *pIVar3;
  function<bool_(CommonDebugInfoInstructions)> *expectation;
  spv_result_t sVar4;
  undefined1 local_249;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  undefined1 local_228 [32];
  DiagnosticStream local_208;
  
  expectation = (function<bool_(CommonDebugInfoInstructions)> *)
                (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_249 = allow_template_param;
  if ((inst->inst_).ext_inst_type == SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
    if ((ulong)word_index <
        (ulong)((long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)expectation >> 2)) {
      pIVar3 = ValidationState_t::FindDef
                         (_,*(uint32_t *)
                             ((long)&(expectation->super__Function_base)._M_functor +
                             (ulong)word_index * 4));
      bVar2 = spvIsExtendedInstruction((uint)(pIVar3->inst_).opcode);
      if (((bVar2) &&
          ((pIVar3->inst_).ext_inst_type == SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100)) &&
         ((pIVar3->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[4] == 0x6c)) {
        return SPV_SUCCESS;
      }
    }
    expectation = (function<bool_(CommonDebugInfoInstructions)> *)
                  (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
  }
  local_228._8_8_ = (spv_const_validator_options)0x0;
  local_228._0_8_ = &local_249;
  local_228._24_8_ =
       std::
       _Function_handler<bool_(CommonDebugInfoInstructions),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_extensions.cpp:267:7)>
       ::_M_invoke;
  local_228._16_8_ =
       std::
       _Function_handler<bool_(CommonDebugInfoInstructions),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_extensions.cpp:267:7)>
       ::_M_manager;
  bVar2 = DoesDebugInfoOperandMatchExpectation
                    ((anon_unknown_0 *)_,(ValidationState_t *)local_228,expectation,
                     (Instruction *)
                     (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,word_index);
  sVar4 = SPV_SUCCESS;
  if (!bVar2) {
    ValidationState_t::diag((DiagnosticStream *)(local_228 + 0x20),_,SPV_ERROR_INVALID_DATA,inst);
    if ((ext_inst_name->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*ext_inst_name->_M_invoker)(&local_248,(_Any_data *)ext_inst_name);
    poVar1 = (ostream *)(local_228 + 0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_248._M_dataplus._M_p,local_248._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"expected operand ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(debug_inst_name->_M_dataplus)._M_p,debug_inst_name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," is not a valid debug type",0x1a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)(local_228 + 0x20));
    sVar4 = local_208.error_;
  }
  if ((code *)local_228._16_8_ != (code *)0x0) {
    (*(code *)local_228._16_8_)(local_228,local_228,3);
  }
  return sVar4;
}

Assistant:

spv_result_t ValidateOperandDebugType(
    ValidationState_t& _, const std::string& debug_inst_name,
    const Instruction* inst, uint32_t word_index,
    const std::function<std::string()>& ext_inst_name,
    bool allow_template_param) {
  // Check for NonSemanticShaderDebugInfo100 specific types.
  if (inst->ext_inst_type() ==
      SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
    std::function<bool(NonSemanticShaderDebugInfo100Instructions)> expectation =
        [](NonSemanticShaderDebugInfo100Instructions dbg_inst) {
          return dbg_inst == NonSemanticShaderDebugInfo100DebugTypeMatrix;
        };
    if (DoesDebugInfoOperandMatchExpectation(_, expectation, inst, word_index))
      return SPV_SUCCESS;
  }

  // Check for common types.
  std::function<bool(CommonDebugInfoInstructions)> expectation =
      [&allow_template_param](CommonDebugInfoInstructions dbg_inst) {
        if (allow_template_param &&
            (dbg_inst == CommonDebugInfoDebugTypeTemplateParameter ||
             dbg_inst == CommonDebugInfoDebugTypeTemplateTemplateParameter)) {
          return true;
        }
        return CommonDebugInfoDebugTypeBasic <= dbg_inst &&
               dbg_inst <= CommonDebugInfoDebugTypeTemplate;
      };
  if (DoesDebugInfoOperandMatchExpectation(_, expectation, inst, word_index))
    return SPV_SUCCESS;

  return _.diag(SPV_ERROR_INVALID_DATA, inst)
         << ext_inst_name() << ": "
         << "expected operand " << debug_inst_name
         << " is not a valid debug type";
}